

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::QuadMiIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  int iVar1;
  float fVar2;
  undefined4 uVar3;
  float **ppfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  byte bVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  int iVar30;
  int iVar31;
  byte bVar32;
  long lVar33;
  long lVar34;
  byte bVar35;
  uint uVar36;
  uint uVar37;
  ulong uVar38;
  ulong uVar39;
  uint uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined4 uVar62;
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [64];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  float fVar70;
  float fVar73;
  float fVar74;
  float fVar75;
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar76 [64];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  float fVar83;
  float fVar84;
  float fVar85;
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  float fVar86;
  undefined1 auVar87 [32];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  RTCFilterFunctionNArguments args;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2820 [16];
  Geometry *local_2810;
  ulong local_2808;
  ulong local_2800;
  Scene *local_27f8;
  long local_27f0;
  ulong local_27e8;
  ulong *local_27e0;
  long local_27d8;
  RTCFilterFunctionNArguments local_27d0;
  undefined1 local_27a0 [32];
  undefined1 local_2770 [16];
  undefined8 local_2760;
  undefined8 uStack_2758;
  undefined8 uStack_2750;
  undefined8 uStack_2748;
  RTCHitN local_2730 [16];
  undefined1 local_2720 [16];
  undefined1 local_2710 [16];
  undefined1 local_2700 [16];
  undefined4 local_26f0;
  undefined4 uStack_26ec;
  undefined4 uStack_26e8;
  undefined4 uStack_26e4;
  undefined1 local_26e0 [16];
  undefined1 local_26d0 [16];
  uint local_26c0;
  uint uStack_26bc;
  uint uStack_26b8;
  uint uStack_26b4;
  uint uStack_26b0;
  uint uStack_26ac;
  uint uStack_26a8;
  uint uStack_26a4;
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined8 local_25a0;
  undefined8 uStack_2598;
  undefined8 uStack_2590;
  undefined8 uStack_2588;
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  byte local_24a0;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0;
  size_t local_23a0;
  undefined4 local_2398 [2];
  ulong local_2390 [1132];
  
  local_27e0 = local_2390;
  local_23a0 = root.ptr;
  local_2398[0] = 0;
  auVar46 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4)));
  auVar88 = ZEXT3264(auVar46);
  auVar47 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x10)));
  auVar89 = ZEXT3264(auVar47);
  auVar48 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x20)));
  auVar90 = ZEXT3264(auVar48);
  auVar45 = vmulss_avx512f(auVar46._0_16_,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  uVar62 = auVar45._0_4_;
  auVar49._4_4_ = uVar62;
  auVar49._0_4_ = uVar62;
  auVar49._8_4_ = uVar62;
  auVar49._12_4_ = uVar62;
  auVar49._16_4_ = uVar62;
  auVar49._20_4_ = uVar62;
  auVar49._24_4_ = uVar62;
  auVar49._28_4_ = uVar62;
  auVar45 = vmulss_avx512f(auVar47._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  uVar62 = auVar45._0_4_;
  auVar50._4_4_ = uVar62;
  auVar50._0_4_ = uVar62;
  auVar50._8_4_ = uVar62;
  auVar50._12_4_ = uVar62;
  auVar50._16_4_ = uVar62;
  auVar50._20_4_ = uVar62;
  auVar50._24_4_ = uVar62;
  auVar50._28_4_ = uVar62;
  auVar45 = vmulss_avx512f(auVar48._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  uVar62 = auVar45._0_4_;
  auVar48._4_4_ = uVar62;
  auVar48._0_4_ = uVar62;
  auVar48._8_4_ = uVar62;
  auVar48._12_4_ = uVar62;
  auVar48._16_4_ = uVar62;
  auVar48._20_4_ = uVar62;
  auVar48._24_4_ = uVar62;
  auVar48._28_4_ = uVar62;
  local_2800 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar38 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar39 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar43 = local_2800 ^ 0x20;
  uVar41 = uVar38 ^ 0x20;
  iVar1 = (tray->tfar).field_0.i[k];
  auVar67 = ZEXT3264(CONCAT428(iVar1,CONCAT424(iVar1,CONCAT420(iVar1,CONCAT416(iVar1,CONCAT412(iVar1
                                                  ,CONCAT48(iVar1,CONCAT44(iVar1,iVar1))))))));
  auVar46 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar91 = ZEXT3264(auVar46);
  auVar47 = vxorps_avx512vl(auVar49,auVar46);
  auVar92 = ZEXT3264(auVar47);
  auVar47 = vxorps_avx512vl(auVar50,auVar46);
  auVar93 = ZEXT3264(auVar47);
  auVar46 = vxorps_avx512vl(auVar48,auVar46);
  auVar94 = ZEXT3264(auVar46);
  auVar46 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar95 = ZEXT3264(auVar46);
  auVar45 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar96 = ZEXT1664(auVar45);
  auVar46 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
  auVar97 = ZEXT3264(auVar46);
  auVar46 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
  auVar98 = ZEXT3264(auVar46);
  auVar45 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
  auVar99 = ZEXT1664(auVar45);
  auVar46 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
  auVar100 = ZEXT3264(auVar46);
  local_27e8 = uVar38;
  do {
    pfVar5 = (float *)(local_27e0 + -1);
    local_27e0 = local_27e0 + -2;
    if (*pfVar5 <= *(float *)(ray + k * 4 + 0x80)) {
      uVar42 = *local_27e0;
      while ((uVar42 & 8) == 0) {
        auVar46 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(uVar42 + 0x40 + local_2800),auVar92._0_32_,
                             auVar88._0_32_);
        auVar47 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(uVar42 + 0x40 + uVar38),auVar93._0_32_,
                             auVar89._0_32_);
        auVar46 = vpmaxsd_avx2(auVar46,auVar47);
        auVar47 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(uVar42 + 0x40 + uVar39),auVar94._0_32_,
                             auVar90._0_32_);
        auVar47 = vpmaxsd_avx512vl(auVar47,auVar95._0_32_);
        auVar46 = vpmaxsd_avx2(auVar46,auVar47);
        auVar47 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(uVar42 + 0x40 + uVar43),auVar92._0_32_,
                             auVar88._0_32_);
        auVar48 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(uVar42 + 0x40 + uVar41),auVar93._0_32_,
                             auVar89._0_32_);
        auVar47 = vpminsd_avx2(auVar47,auVar48);
        auVar48 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(uVar42 + 0x40 + (uVar39 ^ 0x20)),auVar94._0_32_,
                             auVar90._0_32_);
        auVar48 = vpminsd_avx2(auVar48,auVar67._0_32_);
        auVar47 = vpminsd_avx2(auVar47,auVar48);
        uVar44 = vpcmpd_avx512vl(auVar46,auVar47,2);
        bVar32 = (byte)uVar44;
        if (bVar32 == 0) goto LAB_0079c258;
        auVar47 = *(undefined1 (*) [32])(uVar42 & 0xfffffffffffffff0);
        auVar48 = ((undefined1 (*) [32])(uVar42 & 0xfffffffffffffff0))[1];
        auVar49 = vmovdqa64_avx512vl(auVar97._0_32_);
        auVar49 = vpternlogd_avx512vl(auVar49,auVar46,auVar98._0_32_,0xf8);
        auVar50 = vpcompressd_avx512vl(auVar49);
        auVar52._0_4_ =
             (uint)(bVar32 & 1) * auVar50._0_4_ | (uint)!(bool)(bVar32 & 1) * auVar49._0_4_;
        bVar12 = (bool)((byte)(uVar44 >> 1) & 1);
        auVar52._4_4_ = (uint)bVar12 * auVar50._4_4_ | (uint)!bVar12 * auVar49._4_4_;
        bVar12 = (bool)((byte)(uVar44 >> 2) & 1);
        auVar52._8_4_ = (uint)bVar12 * auVar50._8_4_ | (uint)!bVar12 * auVar49._8_4_;
        bVar12 = (bool)((byte)(uVar44 >> 3) & 1);
        auVar52._12_4_ = (uint)bVar12 * auVar50._12_4_ | (uint)!bVar12 * auVar49._12_4_;
        bVar12 = (bool)((byte)(uVar44 >> 4) & 1);
        auVar52._16_4_ = (uint)bVar12 * auVar50._16_4_ | (uint)!bVar12 * auVar49._16_4_;
        bVar12 = (bool)((byte)(uVar44 >> 5) & 1);
        auVar52._20_4_ = (uint)bVar12 * auVar50._20_4_ | (uint)!bVar12 * auVar49._20_4_;
        bVar12 = (bool)((byte)(uVar44 >> 6) & 1);
        auVar52._24_4_ = (uint)bVar12 * auVar50._24_4_ | (uint)!bVar12 * auVar49._24_4_;
        bVar12 = SUB81(uVar44 >> 7,0);
        auVar52._28_4_ = (uint)bVar12 * auVar50._28_4_ | (uint)!bVar12 * auVar49._28_4_;
        auVar49 = vpermt2q_avx512vl(auVar47,auVar52,auVar48);
        uVar42 = auVar49._0_8_;
        bVar32 = bVar32 - 1 & bVar32;
        if (bVar32 != 0) {
          auVar49 = vpshufd_avx2(auVar52,0x55);
          vpermt2q_avx512vl(auVar47,auVar49,auVar48);
          auVar50 = vpminsd_avx2(auVar52,auVar49);
          auVar49 = vpmaxsd_avx2(auVar52,auVar49);
          bVar32 = bVar32 - 1 & bVar32;
          if (bVar32 == 0) {
            auVar50 = vpermi2q_avx512vl(auVar50,auVar47,auVar48);
            uVar42 = auVar50._0_8_;
            auVar47 = vpermt2q_avx512vl(auVar47,auVar49,auVar48);
            *local_27e0 = auVar47._0_8_;
            auVar46 = vpermd_avx2(auVar49,auVar46);
            *(int *)(local_27e0 + 1) = auVar46._0_4_;
            local_27e0 = local_27e0 + 2;
          }
          else {
            auVar56 = vpshufd_avx2(auVar52,0xaa);
            vpermt2q_avx512vl(auVar47,auVar56,auVar48);
            auVar53 = vpminsd_avx2(auVar50,auVar56);
            auVar50 = vpmaxsd_avx2(auVar50,auVar56);
            auVar56 = vpminsd_avx2(auVar49,auVar50);
            auVar49 = vpmaxsd_avx2(auVar49,auVar50);
            bVar32 = bVar32 - 1 & bVar32;
            if (bVar32 == 0) {
              auVar50 = vpermi2q_avx512vl(auVar53,auVar47,auVar48);
              uVar42 = auVar50._0_8_;
              auVar50 = vpermt2q_avx512vl(auVar47,auVar49,auVar48);
              *local_27e0 = auVar50._0_8_;
              auVar49 = vpermd_avx2(auVar49,auVar46);
              *(int *)(local_27e0 + 1) = auVar49._0_4_;
              auVar47 = vpermt2q_avx512vl(auVar47,auVar56,auVar48);
              local_27e0[2] = auVar47._0_8_;
              auVar46 = vpermd_avx2(auVar56,auVar46);
              *(int *)(local_27e0 + 3) = auVar46._0_4_;
              local_27e0 = local_27e0 + 4;
            }
            else {
              auVar50 = vpshufd_avx2(auVar52,0xff);
              vpermt2q_avx512vl(auVar47,auVar50,auVar48);
              auVar57 = vpminsd_avx2(auVar53,auVar50);
              auVar50 = vpmaxsd_avx2(auVar53,auVar50);
              auVar53 = vpminsd_avx2(auVar56,auVar50);
              auVar50 = vpmaxsd_avx2(auVar56,auVar50);
              auVar56 = vpminsd_avx2(auVar49,auVar50);
              auVar49 = vpmaxsd_avx2(auVar49,auVar50);
              bVar32 = bVar32 - 1 & bVar32;
              if (bVar32 == 0) {
                auVar50 = vpermi2q_avx512vl(auVar57,auVar47,auVar48);
                uVar42 = auVar50._0_8_;
                auVar50 = vpermt2q_avx512vl(auVar47,auVar49,auVar48);
                *local_27e0 = auVar50._0_8_;
                auVar49 = vpermd_avx2(auVar49,auVar46);
                *(int *)(local_27e0 + 1) = auVar49._0_4_;
                auVar49 = vpermt2q_avx512vl(auVar47,auVar56,auVar48);
                local_27e0[2] = auVar49._0_8_;
                auVar49 = vpermd_avx2(auVar56,auVar46);
                *(int *)(local_27e0 + 3) = auVar49._0_4_;
                auVar47 = vpermt2q_avx512vl(auVar47,auVar53,auVar48);
                local_27e0[4] = auVar47._0_8_;
                auVar46 = vpermd_avx2(auVar53,auVar46);
                *(int *)(local_27e0 + 5) = auVar46._0_4_;
                local_27e0 = local_27e0 + 6;
              }
              else {
                auVar51 = valignd_avx512vl(auVar52,auVar52,3);
                auVar50 = vmovdqa64_avx512vl(auVar99._0_32_);
                auVar52 = vpermt2d_avx512vl(auVar50,auVar100._0_32_,auVar57);
                auVar50 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                auVar52 = vpermt2d_avx512vl(auVar52,auVar50,auVar53);
                auVar52 = vpermt2d_avx512vl(auVar52,auVar50,auVar56);
                auVar50 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                auVar49 = vpermt2d_avx512vl(auVar52,auVar50,auVar49);
                auVar76 = ZEXT3264(auVar49);
                bVar35 = bVar32;
                do {
                  auVar50 = auVar76._0_32_;
                  auVar56._8_4_ = 1;
                  auVar56._0_8_ = 0x100000001;
                  auVar56._12_4_ = 1;
                  auVar56._16_4_ = 1;
                  auVar56._20_4_ = 1;
                  auVar56._24_4_ = 1;
                  auVar56._28_4_ = 1;
                  auVar49 = vpermd_avx2(auVar56,auVar51);
                  auVar51 = valignd_avx512vl(auVar51,auVar51,1);
                  vpermt2q_avx512vl(auVar47,auVar51,auVar48);
                  bVar35 = bVar35 - 1 & bVar35;
                  uVar23 = vpcmpd_avx512vl(auVar49,auVar50,5);
                  auVar49 = vpmaxsd_avx2(auVar49,auVar50);
                  bVar24 = (byte)uVar23 << 1;
                  auVar50 = valignd_avx512vl(auVar50,auVar50,7);
                  bVar12 = (bool)((byte)uVar23 & 1);
                  auVar53._4_4_ = (uint)bVar12 * auVar50._4_4_ | (uint)!bVar12 * auVar49._4_4_;
                  auVar53._0_4_ = auVar49._0_4_;
                  bVar12 = (bool)(bVar24 >> 2 & 1);
                  auVar53._8_4_ = (uint)bVar12 * auVar50._8_4_ | (uint)!bVar12 * auVar49._8_4_;
                  bVar12 = (bool)(bVar24 >> 3 & 1);
                  auVar53._12_4_ = (uint)bVar12 * auVar50._12_4_ | (uint)!bVar12 * auVar49._12_4_;
                  bVar12 = (bool)(bVar24 >> 4 & 1);
                  auVar53._16_4_ = (uint)bVar12 * auVar50._16_4_ | (uint)!bVar12 * auVar49._16_4_;
                  bVar12 = (bool)(bVar24 >> 5 & 1);
                  auVar53._20_4_ = (uint)bVar12 * auVar50._20_4_ | (uint)!bVar12 * auVar49._20_4_;
                  bVar12 = (bool)(bVar24 >> 6 & 1);
                  auVar53._24_4_ = (uint)bVar12 * auVar50._24_4_ | (uint)!bVar12 * auVar49._24_4_;
                  auVar53._28_4_ =
                       (uint)(bVar24 >> 7) * auVar50._28_4_ |
                       (uint)!(bool)(bVar24 >> 7) * auVar49._28_4_;
                  auVar76 = ZEXT3264(auVar53);
                } while (bVar35 != 0);
                lVar33 = (ulong)(uint)POPCOUNT((uint)bVar32) + 3;
                do {
                  auVar49 = vpermi2q_avx512vl(auVar53,auVar47,auVar48);
                  *local_27e0 = auVar49._0_8_;
                  auVar50 = auVar76._0_32_;
                  auVar49 = vpermd_avx2(auVar50,auVar46);
                  *(int *)(local_27e0 + 1) = auVar49._0_4_;
                  auVar53 = valignd_avx512vl(auVar50,auVar50,1);
                  local_27e0 = local_27e0 + 2;
                  auVar76 = ZEXT3264(auVar53);
                  lVar33 = lVar33 + -1;
                } while (lVar33 != 0);
                auVar46 = vpermt2q_avx512vl(auVar47,auVar53,auVar48);
                uVar42 = auVar46._0_8_;
              }
            }
          }
        }
      }
      local_27d8 = (ulong)((uint)uVar42 & 0xf) - 8;
      if (local_27d8 != 0) {
        uVar42 = uVar42 & 0xfffffffffffffff0;
        local_27f0 = 0;
        do {
          lVar34 = local_27f0 * 0x60;
          local_27f8 = context->scene;
          ppfVar4 = (local_27f8->vertices).items;
          pfVar5 = ppfVar4[*(uint *)(uVar42 + 0x48 + lVar34)];
          auVar69._16_16_ = *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar42 + 0x28 + lVar34));
          auVar69._0_16_ = *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar42 + 8 + lVar34));
          pfVar6 = ppfVar4[*(uint *)(uVar42 + 0x40 + lVar34)];
          auVar71._16_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar42 + 0x20 + lVar34));
          auVar71._0_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar42 + lVar34));
          pfVar7 = ppfVar4[*(uint *)(uVar42 + 0x4c + lVar34)];
          auVar78._16_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar42 + 0x2c + lVar34));
          auVar78._0_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar42 + 0xc + lVar34));
          pfVar8 = ppfVar4[*(uint *)(uVar42 + 0x44 + lVar34)];
          auVar81._16_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar42 + 0x24 + lVar34));
          auVar81._0_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar42 + 4 + lVar34));
          lVar33 = uVar42 + 0x40 + lVar34;
          local_25a0 = *(undefined8 *)(lVar33 + 0x10);
          uStack_2598 = *(undefined8 *)(lVar33 + 0x18);
          uStack_2590 = local_25a0;
          uStack_2588 = uStack_2598;
          lVar33 = uVar42 + 0x50 + lVar34;
          local_2760 = *(undefined8 *)(lVar33 + 0x10);
          uStack_2758 = *(undefined8 *)(lVar33 + 0x18);
          auVar14 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar42 + 0x10 + lVar34))
                                  ,*(undefined1 (*) [16])
                                    (pfVar5 + *(uint *)(uVar42 + 0x18 + lVar34)));
          auVar45 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar42 + 0x10 + lVar34))
                                  ,*(undefined1 (*) [16])
                                    (pfVar5 + *(uint *)(uVar42 + 0x18 + lVar34)));
          auVar15 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar42 + 0x14 + lVar34))
                                  ,*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar42 + 0x1c + lVar34)));
          auVar13 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar42 + 0x14 + lVar34))
                                  ,*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar42 + 0x1c + lVar34)));
          auVar16 = vunpcklps_avx(auVar45,auVar13);
          auVar17 = vunpcklps_avx(auVar14,auVar15);
          auVar45 = vunpckhps_avx(auVar14,auVar15);
          auVar15 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar42 + 0x30 + lVar34))
                                  ,*(undefined1 (*) [16])
                                    (pfVar5 + *(uint *)(uVar42 + 0x38 + lVar34)));
          auVar13 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar42 + 0x30 + lVar34))
                                  ,*(undefined1 (*) [16])
                                    (pfVar5 + *(uint *)(uVar42 + 0x38 + lVar34)));
          auVar18 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar42 + 0x34 + lVar34))
                                  ,*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar42 + 0x3c + lVar34)));
          auVar14 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar42 + 0x34 + lVar34))
                                  ,*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar42 + 0x3c + lVar34)));
          auVar14 = vunpcklps_avx(auVar13,auVar14);
          auVar19 = vunpcklps_avx(auVar15,auVar18);
          auVar13 = vunpckhps_avx(auVar15,auVar18);
          uStack_2750 = local_2760;
          uStack_2748 = uStack_2758;
          auVar46 = vunpcklps_avx(auVar81,auVar78);
          auVar47 = vunpcklps_avx(auVar71,auVar69);
          auVar56 = vunpcklps_avx(auVar47,auVar46);
          auVar53 = vunpckhps_avx(auVar47,auVar46);
          auVar46 = vunpckhps_avx(auVar81,auVar78);
          auVar47 = vunpckhps_avx(auVar71,auVar69);
          auVar57 = vunpcklps_avx(auVar47,auVar46);
          auVar46._16_16_ = auVar17;
          auVar46._0_16_ = auVar17;
          auVar47._16_16_ = auVar45;
          auVar47._0_16_ = auVar45;
          auVar68._16_16_ = auVar16;
          auVar68._0_16_ = auVar16;
          auVar79._16_16_ = auVar19;
          auVar79._0_16_ = auVar19;
          auVar77._16_16_ = auVar13;
          auVar77._0_16_ = auVar13;
          auVar63._16_16_ = auVar14;
          auVar63._0_16_ = auVar14;
          auVar46 = vsubps_avx(auVar56,auVar46);
          auVar47 = vsubps_avx(auVar53,auVar47);
          auVar48 = vsubps_avx(auVar57,auVar68);
          auVar49 = vsubps_avx(auVar79,auVar56);
          auVar50 = vsubps_avx(auVar77,auVar53);
          auVar52 = vsubps_avx(auVar63,auVar57);
          auVar54._4_4_ = auVar47._4_4_ * auVar52._4_4_;
          auVar54._0_4_ = auVar47._0_4_ * auVar52._0_4_;
          auVar54._8_4_ = auVar47._8_4_ * auVar52._8_4_;
          auVar54._12_4_ = auVar47._12_4_ * auVar52._12_4_;
          auVar54._16_4_ = auVar47._16_4_ * auVar52._16_4_;
          auVar54._20_4_ = auVar47._20_4_ * auVar52._20_4_;
          auVar54._24_4_ = auVar47._24_4_ * auVar52._24_4_;
          auVar54._28_4_ = auVar14._12_4_;
          auVar13 = vfmsub231ps_fma(auVar54,auVar50,auVar48);
          auVar55._4_4_ = auVar48._4_4_ * auVar49._4_4_;
          auVar55._0_4_ = auVar48._0_4_ * auVar49._0_4_;
          auVar55._8_4_ = auVar48._8_4_ * auVar49._8_4_;
          auVar55._12_4_ = auVar48._12_4_ * auVar49._12_4_;
          auVar55._16_4_ = auVar48._16_4_ * auVar49._16_4_;
          auVar55._20_4_ = auVar48._20_4_ * auVar49._20_4_;
          auVar55._24_4_ = auVar48._24_4_ * auVar49._24_4_;
          auVar55._28_4_ = auVar16._12_4_;
          auVar14 = vfmsub231ps_fma(auVar55,auVar52,auVar46);
          auVar26._4_4_ = auVar46._4_4_ * auVar50._4_4_;
          auVar26._0_4_ = auVar46._0_4_ * auVar50._0_4_;
          auVar26._8_4_ = auVar46._8_4_ * auVar50._8_4_;
          auVar26._12_4_ = auVar46._12_4_ * auVar50._12_4_;
          auVar26._16_4_ = auVar46._16_4_ * auVar50._16_4_;
          auVar26._20_4_ = auVar46._20_4_ * auVar50._20_4_;
          auVar26._24_4_ = auVar46._24_4_ * auVar50._24_4_;
          auVar26._28_4_ = auVar17._12_4_;
          uVar62 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar82._4_4_ = uVar62;
          auVar82._0_4_ = uVar62;
          auVar82._8_4_ = uVar62;
          auVar82._12_4_ = uVar62;
          auVar82._16_4_ = uVar62;
          auVar82._20_4_ = uVar62;
          auVar82._24_4_ = uVar62;
          auVar82._28_4_ = uVar62;
          auVar54 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
          auVar55 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
          uVar62 = *(undefined4 *)(ray + k * 4);
          auVar51._4_4_ = uVar62;
          auVar51._0_4_ = uVar62;
          auVar51._8_4_ = uVar62;
          auVar51._12_4_ = uVar62;
          auVar51._16_4_ = uVar62;
          auVar51._20_4_ = uVar62;
          auVar51._24_4_ = uVar62;
          auVar51._28_4_ = uVar62;
          auVar56 = vsubps_avx512vl(auVar56,auVar51);
          auVar15 = vfmsub231ps_fma(auVar26,auVar49,auVar47);
          uVar62 = *(undefined4 *)(ray + k * 4 + 0x10);
          auVar58._4_4_ = uVar62;
          auVar58._0_4_ = uVar62;
          auVar58._8_4_ = uVar62;
          auVar58._12_4_ = uVar62;
          auVar58._16_4_ = uVar62;
          auVar58._20_4_ = uVar62;
          auVar58._24_4_ = uVar62;
          auVar58._28_4_ = uVar62;
          auVar53 = vsubps_avx512vl(auVar53,auVar58);
          uVar62 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar59._4_4_ = uVar62;
          auVar59._0_4_ = uVar62;
          auVar59._8_4_ = uVar62;
          auVar59._12_4_ = uVar62;
          auVar59._16_4_ = uVar62;
          auVar59._20_4_ = uVar62;
          auVar59._24_4_ = uVar62;
          auVar59._28_4_ = uVar62;
          auVar51 = vsubps_avx512vl(auVar57,auVar59);
          auVar57 = vmulps_avx512vl(auVar54,auVar51);
          auVar58 = vfmsub231ps_avx512vl(auVar57,auVar53,auVar55);
          auVar57 = vmulps_avx512vl(auVar55,auVar56);
          auVar16 = vfmsub231ps_fma(auVar57,auVar51,auVar82);
          auVar57 = vmulps_avx512vl(auVar82,auVar53);
          auVar59 = vfmsub231ps_avx512vl(auVar57,auVar56,auVar54);
          auVar57 = vmulps_avx512vl(ZEXT1632(auVar15),auVar55);
          auVar57 = vfmadd231ps_avx512vl(auVar57,ZEXT1632(auVar14),auVar54);
          local_2520 = vfmadd231ps_avx512vl(auVar57,ZEXT1632(auVar13),auVar82);
          auVar57._8_4_ = 0x7fffffff;
          auVar57._0_8_ = 0x7fffffff7fffffff;
          auVar57._12_4_ = 0x7fffffff;
          auVar57._16_4_ = 0x7fffffff;
          auVar57._20_4_ = 0x7fffffff;
          auVar57._24_4_ = 0x7fffffff;
          auVar57._28_4_ = 0x7fffffff;
          vandps_avx512vl(local_2520,auVar57);
          vandps_avx512vl(local_2520,auVar91._0_32_);
          auVar52 = vmulps_avx512vl(auVar52,auVar59);
          auVar45 = vfmadd231ps_fma(auVar52,ZEXT1632(auVar16),auVar50);
          auVar45 = vfmadd231ps_fma(ZEXT1632(auVar45),auVar58,auVar49);
          fVar70 = local_2520._0_4_;
          local_2580._0_4_ = (float)((uint)fVar70 ^ auVar45._0_4_);
          fVar73 = local_2520._4_4_;
          local_2580._4_4_ = (float)((uint)fVar73 ^ auVar45._4_4_);
          fVar74 = local_2520._8_4_;
          local_2580._8_4_ = (float)((uint)fVar74 ^ auVar45._8_4_);
          fVar75 = local_2520._12_4_;
          local_2580._12_4_ = (float)((uint)fVar75 ^ auVar45._12_4_);
          fVar83 = local_2520._16_4_;
          local_2580._16_4_ = fVar83;
          fVar84 = local_2520._20_4_;
          local_2580._20_4_ = fVar84;
          fVar85 = local_2520._24_4_;
          local_2580._24_4_ = fVar85;
          fVar86 = local_2520._28_4_;
          local_2580._28_4_ = fVar86;
          auVar48 = vmulps_avx512vl(auVar48,auVar59);
          auVar45 = vfmadd231ps_fma(auVar48,auVar47,ZEXT1632(auVar16));
          auVar45 = vfmadd231ps_fma(ZEXT1632(auVar45),auVar46,auVar58);
          local_2560._0_4_ = (float)((uint)fVar70 ^ auVar45._0_4_);
          local_2560._4_4_ = (float)((uint)fVar73 ^ auVar45._4_4_);
          local_2560._8_4_ = (float)((uint)fVar74 ^ auVar45._8_4_);
          local_2560._12_4_ = (float)((uint)fVar75 ^ auVar45._12_4_);
          local_2560._16_4_ = fVar83;
          local_2560._20_4_ = fVar84;
          local_2560._24_4_ = fVar85;
          local_2560._28_4_ = fVar86;
          uVar23 = vcmpps_avx512vl(local_2580,ZEXT832(0) << 0x20,5);
          uVar20 = vcmpps_avx512vl(local_2560,ZEXT832(0) << 0x20,5);
          uVar21 = vcmpps_avx512vl(local_2520,ZEXT832(0) << 0x20,4);
          auVar87._0_4_ = local_2580._0_4_ + local_2560._0_4_;
          auVar87._4_4_ = local_2580._4_4_ + local_2560._4_4_;
          auVar87._8_4_ = local_2580._8_4_ + local_2560._8_4_;
          auVar87._12_4_ = local_2580._12_4_ + local_2560._12_4_;
          auVar87._16_4_ = fVar83 + fVar83;
          auVar87._20_4_ = fVar84 + fVar84;
          auVar87._24_4_ = fVar85 + fVar85;
          auVar87._28_4_ = fVar86 + fVar86;
          uVar22 = vcmpps_avx512vl(auVar87,local_2520,2);
          local_24a0 = (byte)uVar23 & (byte)uVar20 & (byte)uVar21 & (byte)uVar22;
          if (local_24a0 != 0) {
            auVar27._4_4_ = auVar51._4_4_ * auVar15._4_4_;
            auVar27._0_4_ = auVar51._0_4_ * auVar15._0_4_;
            auVar27._8_4_ = auVar51._8_4_ * auVar15._8_4_;
            auVar27._12_4_ = auVar51._12_4_ * auVar15._12_4_;
            auVar27._16_4_ = auVar51._16_4_ * 0.0;
            auVar27._20_4_ = auVar51._20_4_ * 0.0;
            auVar27._24_4_ = auVar51._24_4_ * 0.0;
            auVar27._28_4_ = auVar51._28_4_;
            auVar45 = vfmadd213ps_fma(auVar53,ZEXT1632(auVar14),auVar27);
            auVar45 = vfmadd213ps_fma(auVar56,ZEXT1632(auVar13),ZEXT1632(auVar45));
            local_2540._0_4_ = (float)((uint)fVar70 ^ auVar45._0_4_);
            local_2540._4_4_ = (float)((uint)fVar73 ^ auVar45._4_4_);
            local_2540._8_4_ = (float)((uint)fVar74 ^ auVar45._8_4_);
            local_2540._12_4_ = (float)((uint)fVar75 ^ auVar45._12_4_);
            local_2540._16_4_ = fVar83;
            local_2540._20_4_ = fVar84;
            local_2540._24_4_ = fVar85;
            local_2540._28_4_ = fVar86;
            uVar62 = *(undefined4 *)(ray + k * 4 + 0x30);
            auVar25._4_4_ = uVar62;
            auVar25._0_4_ = uVar62;
            auVar25._8_4_ = uVar62;
            auVar25._12_4_ = uVar62;
            auVar25._16_4_ = uVar62;
            auVar25._20_4_ = uVar62;
            auVar25._24_4_ = uVar62;
            auVar25._28_4_ = uVar62;
            auVar46 = vmulps_avx512vl(local_2520,auVar25);
            uVar23 = vcmpps_avx512vl(auVar46,local_2540,1);
            fVar2 = *(float *)(ray + k * 4 + 0x80);
            auVar67 = ZEXT3264(CONCAT428(fVar2,CONCAT424(fVar2,CONCAT420(fVar2,CONCAT416(fVar2,
                                                  CONCAT412(fVar2,CONCAT48(fVar2,CONCAT44(fVar2,
                                                  fVar2))))))));
            auVar28._4_4_ = fVar2 * fVar73;
            auVar28._0_4_ = fVar2 * fVar70;
            auVar28._8_4_ = fVar2 * fVar74;
            auVar28._12_4_ = fVar2 * fVar75;
            auVar28._16_4_ = fVar2 * fVar83;
            auVar28._20_4_ = fVar2 * fVar84;
            auVar28._24_4_ = fVar2 * fVar85;
            auVar28._28_4_ = auVar46._28_4_;
            uVar20 = vcmpps_avx512vl(local_2540,auVar28,2);
            local_24a0 = (byte)uVar23 & (byte)uVar20 & local_24a0;
            uVar38 = (ulong)local_24a0;
            if (local_24a0 != 0) {
              local_2500 = ZEXT1632(auVar13);
              local_24e0 = ZEXT1632(auVar14);
              local_24c0 = ZEXT1632(auVar15);
              local_23c0 = 0xf0;
              auVar46 = vrcp14ps_avx512vl(local_2520);
              auVar80._8_4_ = 0x3f800000;
              auVar80._0_8_ = 0x3f8000003f800000;
              auVar80._12_4_ = 0x3f800000;
              auVar80._16_4_ = 0x3f800000;
              auVar80._20_4_ = 0x3f800000;
              auVar80._24_4_ = 0x3f800000;
              auVar80._28_4_ = 0x3f800000;
              auVar45 = vfnmadd213ps_fma(local_2520,auVar46,auVar80);
              auVar45 = vfmadd132ps_fma(ZEXT1632(auVar45),auVar46,auVar46);
              fVar70 = auVar45._0_4_;
              fVar73 = auVar45._4_4_;
              local_2440._4_4_ = fVar73 * local_2540._4_4_;
              local_2440._0_4_ = fVar70 * local_2540._0_4_;
              fVar74 = auVar45._8_4_;
              local_2440._8_4_ = fVar74 * local_2540._8_4_;
              fVar75 = auVar45._12_4_;
              local_2440._12_4_ = fVar75 * local_2540._12_4_;
              local_2440._16_4_ = fVar83 * 0.0;
              local_2440._20_4_ = fVar84 * 0.0;
              local_2440._24_4_ = fVar85 * 0.0;
              local_2440._28_4_ = auVar46._28_4_;
              auVar76 = ZEXT3264(local_2440);
              auVar29._4_4_ = fVar73 * local_2580._4_4_;
              auVar29._0_4_ = fVar70 * local_2580._0_4_;
              auVar29._8_4_ = fVar74 * local_2580._8_4_;
              auVar29._12_4_ = fVar75 * local_2580._12_4_;
              auVar29._16_4_ = fVar83 * 0.0;
              auVar29._20_4_ = fVar84 * 0.0;
              auVar29._24_4_ = fVar85 * 0.0;
              auVar29._28_4_ = fVar86;
              auVar46 = vminps_avx(auVar29,auVar80);
              auVar72._0_4_ = fVar70 * local_2560._0_4_;
              auVar72._4_4_ = fVar73 * local_2560._4_4_;
              auVar72._8_4_ = fVar74 * local_2560._8_4_;
              auVar72._12_4_ = fVar75 * local_2560._12_4_;
              auVar72._16_4_ = fVar83 * 0.0;
              auVar72._20_4_ = fVar84 * 0.0;
              auVar72._24_4_ = fVar85 * 0.0;
              auVar72._28_4_ = 0;
              auVar47 = vminps_avx(auVar72,auVar80);
              auVar48 = vsubps_avx(auVar80,auVar46);
              auVar49 = vsubps_avx(auVar80,auVar47);
              local_2460 = vblendps_avx(auVar47,auVar48,0xf0);
              local_2480 = vblendps_avx(auVar46,auVar49,0xf0);
              fVar70 = (float)DAT_01fef940;
              local_2420._0_4_ = auVar13._0_4_ * fVar70;
              fVar73 = DAT_01fef940._4_4_;
              local_2420._4_4_ = auVar13._4_4_ * fVar73;
              fVar74 = DAT_01fef940._8_4_;
              local_2420._8_4_ = auVar13._8_4_ * fVar74;
              fVar75 = DAT_01fef940._12_4_;
              local_2420._12_4_ = auVar13._12_4_ * fVar75;
              fVar83 = DAT_01fef940._16_4_;
              local_2420._16_4_ = fVar83 * 0.0;
              fVar84 = DAT_01fef940._20_4_;
              local_2420._20_4_ = fVar84 * 0.0;
              fVar85 = DAT_01fef940._24_4_;
              local_2420._24_4_ = fVar85 * 0.0;
              local_2420._28_4_ = 0;
              local_2400._0_4_ = auVar14._0_4_ * fVar70;
              local_2400._4_4_ = auVar14._4_4_ * fVar73;
              local_2400._8_4_ = auVar14._8_4_ * fVar74;
              local_2400._12_4_ = auVar14._12_4_ * fVar75;
              local_2400._16_4_ = fVar83 * 0.0;
              local_2400._20_4_ = fVar84 * 0.0;
              local_2400._24_4_ = fVar85 * 0.0;
              local_2400._28_4_ = 0;
              local_23e0._4_4_ = auVar15._4_4_ * fVar73;
              local_23e0._0_4_ = auVar15._0_4_ * fVar70;
              local_23e0._8_4_ = auVar15._8_4_ * fVar74;
              local_23e0._12_4_ = auVar15._12_4_ * fVar75;
              local_23e0._16_4_ = fVar83 * 0.0;
              local_23e0._20_4_ = fVar84 * 0.0;
              local_23e0._24_4_ = fVar85 * 0.0;
              local_23e0._28_4_ = 0;
              auVar64._8_4_ = 0x7f800000;
              auVar64._0_8_ = 0x7f8000007f800000;
              auVar64._12_4_ = 0x7f800000;
              auVar64._16_4_ = 0x7f800000;
              auVar64._20_4_ = 0x7f800000;
              auVar64._24_4_ = 0x7f800000;
              auVar64._28_4_ = 0x7f800000;
              auVar46 = vblendmps_avx512vl(auVar64,local_2440);
              auVar60._0_4_ =
                   (uint)(local_24a0 & 1) * auVar46._0_4_ |
                   (uint)!(bool)(local_24a0 & 1) * 0x7f800000;
              bVar12 = (bool)(local_24a0 >> 1 & 1);
              auVar60._4_4_ = (uint)bVar12 * auVar46._4_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(local_24a0 >> 2 & 1);
              auVar60._8_4_ = (uint)bVar12 * auVar46._8_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(local_24a0 >> 3 & 1);
              auVar60._12_4_ = (uint)bVar12 * auVar46._12_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(local_24a0 >> 4 & 1);
              auVar60._16_4_ = (uint)bVar12 * auVar46._16_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(local_24a0 >> 5 & 1);
              auVar60._20_4_ = (uint)bVar12 * auVar46._20_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(local_24a0 >> 6 & 1);
              auVar60._24_4_ = (uint)bVar12 * auVar46._24_4_ | (uint)!bVar12 * 0x7f800000;
              auVar60._28_4_ =
                   (uint)(local_24a0 >> 7) * auVar46._28_4_ |
                   (uint)!(bool)(local_24a0 >> 7) * 0x7f800000;
              auVar46 = vshufps_avx(auVar60,auVar60,0xb1);
              auVar46 = vminps_avx(auVar60,auVar46);
              auVar47 = vshufpd_avx(auVar46,auVar46,5);
              auVar46 = vminps_avx(auVar46,auVar47);
              auVar47 = vpermpd_avx2(auVar46,0x4e);
              auVar46 = vminps_avx(auVar46,auVar47);
              uVar23 = vcmpps_avx512vl(auVar60,auVar46,0);
              bVar32 = local_24a0;
              if (((byte)uVar23 & local_24a0) != 0) {
                bVar32 = (byte)uVar23 & local_24a0;
              }
              uVar36 = 0;
              for (uVar37 = (uint)bVar32; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x80000000) {
                uVar36 = uVar36 + 1;
              }
              do {
                uVar40 = uVar36 & 0xff;
                local_2808 = (ulong)uVar40;
                uVar37 = *(uint *)((long)&local_25a0 + local_2808 * 4);
                local_2810 = (local_27f8->geometries).items[uVar37].ptr;
                if ((local_2810->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  uVar38 = (ulong)(byte)(~(byte)(1 << (uVar36 & 0x1f)) & (byte)uVar38);
                }
                else {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (local_2810->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    uVar38 = (ulong)(uVar40 << 2);
                    uVar62 = *(undefined4 *)(local_2480 + uVar38);
                    uVar3 = *(undefined4 *)(local_2460 + uVar38);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2440 + uVar38);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_2420 + uVar38);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_2400 + uVar38);
                    *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_23e0 + uVar38);
                    *(undefined4 *)(ray + k * 4 + 0xf0) = uVar62;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar3;
                    *(undefined4 *)(ray + k * 4 + 0x110) =
                         *(undefined4 *)((long)&local_2760 + uVar38);
                    *(uint *)(ray + k * 4 + 0x120) = uVar37;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    break;
                  }
                  local_26a0 = auVar76._0_32_;
                  local_27a0 = auVar67._0_32_;
                  local_2680 = vmovdqa64_avx512vl(auVar95._0_32_);
                  local_2660 = auVar94._0_32_;
                  local_2640 = auVar93._0_32_;
                  local_2620 = auVar92._0_32_;
                  local_2600 = auVar90._0_32_;
                  local_25e0 = auVar89._0_32_;
                  local_25c0 = auVar88._0_32_;
                  uVar44 = (ulong)(uVar40 * 4);
                  uVar62 = *(undefined4 *)(local_2480 + uVar44);
                  local_2700._4_4_ = uVar62;
                  local_2700._0_4_ = uVar62;
                  local_2700._8_4_ = uVar62;
                  local_2700._12_4_ = uVar62;
                  local_26f0 = *(undefined4 *)(local_2460 + uVar44);
                  local_26d0 = vpbroadcastd_avx512vl();
                  uVar62 = *(undefined4 *)((long)&local_2760 + uVar44);
                  local_26e0._4_4_ = uVar62;
                  local_26e0._0_4_ = uVar62;
                  local_26e0._8_4_ = uVar62;
                  local_26e0._12_4_ = uVar62;
                  uVar62 = *(undefined4 *)(local_2420 + uVar44);
                  uVar3 = *(undefined4 *)(local_2400 + uVar44);
                  local_2720._4_4_ = uVar3;
                  local_2720._0_4_ = uVar3;
                  local_2720._8_4_ = uVar3;
                  local_2720._12_4_ = uVar3;
                  uVar3 = *(undefined4 *)(local_23e0 + uVar44);
                  local_2710._4_4_ = uVar3;
                  local_2710._0_4_ = uVar3;
                  local_2710._8_4_ = uVar3;
                  local_2710._12_4_ = uVar3;
                  local_2730[0] = (RTCHitN)(char)uVar62;
                  local_2730[1] = (RTCHitN)(char)((uint)uVar62 >> 8);
                  local_2730[2] = (RTCHitN)(char)((uint)uVar62 >> 0x10);
                  local_2730[3] = (RTCHitN)(char)((uint)uVar62 >> 0x18);
                  local_2730[4] = (RTCHitN)(char)uVar62;
                  local_2730[5] = (RTCHitN)(char)((uint)uVar62 >> 8);
                  local_2730[6] = (RTCHitN)(char)((uint)uVar62 >> 0x10);
                  local_2730[7] = (RTCHitN)(char)((uint)uVar62 >> 0x18);
                  local_2730[8] = (RTCHitN)(char)uVar62;
                  local_2730[9] = (RTCHitN)(char)((uint)uVar62 >> 8);
                  local_2730[10] = (RTCHitN)(char)((uint)uVar62 >> 0x10);
                  local_2730[0xb] = (RTCHitN)(char)((uint)uVar62 >> 0x18);
                  local_2730[0xc] = (RTCHitN)(char)uVar62;
                  local_2730[0xd] = (RTCHitN)(char)((uint)uVar62 >> 8);
                  local_2730[0xe] = (RTCHitN)(char)((uint)uVar62 >> 0x10);
                  local_2730[0xf] = (RTCHitN)(char)((uint)uVar62 >> 0x18);
                  uStack_26ec = local_26f0;
                  uStack_26e8 = local_26f0;
                  uStack_26e4 = local_26f0;
                  vpcmpeqd_avx2(ZEXT1632(local_2700),ZEXT1632(local_2700));
                  uStack_26bc = context->user->instID[0];
                  local_26c0 = uStack_26bc;
                  uStack_26b8 = uStack_26bc;
                  uStack_26b4 = uStack_26bc;
                  uStack_26b0 = context->user->instPrimID[0];
                  uStack_26ac = uStack_26b0;
                  uStack_26a8 = uStack_26b0;
                  uStack_26a4 = uStack_26b0;
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2440 + uVar44);
                  auVar45 = auVar96._0_16_;
                  local_2820 = vmovdqa64_avx512vl(auVar45);
                  local_27d0.valid = (int *)local_2820;
                  local_27d0.geometryUserPtr = local_2810->userPtr;
                  local_27d0.context = context->user;
                  local_27d0.hit = local_2730;
                  local_27d0.N = 4;
                  local_2770 = vmovdqa64_avx512vl(auVar45);
                  auVar45 = vmovdqa64_avx512vl(auVar45);
                  local_27d0.ray = (RTCRayN *)ray;
                  if (local_2810->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*local_2810->intersectionFilterN)(&local_27d0);
                    auVar45 = local_2820;
                  }
                  uVar44 = vptestmd_avx512vl(auVar45,auVar45);
                  if ((uVar44 & 0xf) == 0) {
LAB_0079c0a4:
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_27a0._0_4_;
                  }
                  else {
                    p_Var9 = context->args->filter;
                    if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((local_2810->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var9)(&local_27d0);
                      auVar45 = local_2820;
                    }
                    uVar44 = vptestmd_avx512vl(auVar45,auVar45);
                    uVar44 = uVar44 & 0xf;
                    bVar32 = (byte)uVar44;
                    if (bVar32 == 0) goto LAB_0079c0a4;
                    iVar1 = *(int *)(local_27d0.hit + 4);
                    iVar30 = *(int *)(local_27d0.hit + 8);
                    iVar31 = *(int *)(local_27d0.hit + 0xc);
                    bVar12 = (bool)((byte)(uVar44 >> 1) & 1);
                    bVar10 = (bool)((byte)(uVar44 >> 2) & 1);
                    bVar11 = SUB81(uVar44 >> 3,0);
                    *(uint *)(local_27d0.ray + 0xc0) =
                         (uint)(bVar32 & 1) * *(int *)local_27d0.hit |
                         (uint)!(bool)(bVar32 & 1) * *(int *)(local_27d0.ray + 0xc0);
                    *(uint *)(local_27d0.ray + 0xc4) =
                         (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_27d0.ray + 0xc4);
                    *(uint *)(local_27d0.ray + 200) =
                         (uint)bVar10 * iVar30 | (uint)!bVar10 * *(int *)(local_27d0.ray + 200);
                    *(uint *)(local_27d0.ray + 0xcc) =
                         (uint)bVar11 * iVar31 | (uint)!bVar11 * *(int *)(local_27d0.ray + 0xcc);
                    iVar1 = *(int *)(local_27d0.hit + 0x14);
                    iVar30 = *(int *)(local_27d0.hit + 0x18);
                    iVar31 = *(int *)(local_27d0.hit + 0x1c);
                    bVar12 = (bool)((byte)(uVar44 >> 1) & 1);
                    bVar10 = (bool)((byte)(uVar44 >> 2) & 1);
                    bVar11 = SUB81(uVar44 >> 3,0);
                    *(uint *)(local_27d0.ray + 0xd0) =
                         (uint)(bVar32 & 1) * *(int *)(local_27d0.hit + 0x10) |
                         (uint)!(bool)(bVar32 & 1) * *(int *)(local_27d0.ray + 0xd0);
                    *(uint *)(local_27d0.ray + 0xd4) =
                         (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_27d0.ray + 0xd4);
                    *(uint *)(local_27d0.ray + 0xd8) =
                         (uint)bVar10 * iVar30 | (uint)!bVar10 * *(int *)(local_27d0.ray + 0xd8);
                    *(uint *)(local_27d0.ray + 0xdc) =
                         (uint)bVar11 * iVar31 | (uint)!bVar11 * *(int *)(local_27d0.ray + 0xdc);
                    iVar1 = *(int *)(local_27d0.hit + 0x24);
                    iVar30 = *(int *)(local_27d0.hit + 0x28);
                    iVar31 = *(int *)(local_27d0.hit + 0x2c);
                    bVar12 = (bool)((byte)(uVar44 >> 1) & 1);
                    bVar10 = (bool)((byte)(uVar44 >> 2) & 1);
                    bVar11 = SUB81(uVar44 >> 3,0);
                    *(uint *)(local_27d0.ray + 0xe0) =
                         (uint)(bVar32 & 1) * *(int *)(local_27d0.hit + 0x20) |
                         (uint)!(bool)(bVar32 & 1) * *(int *)(local_27d0.ray + 0xe0);
                    *(uint *)(local_27d0.ray + 0xe4) =
                         (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_27d0.ray + 0xe4);
                    *(uint *)(local_27d0.ray + 0xe8) =
                         (uint)bVar10 * iVar30 | (uint)!bVar10 * *(int *)(local_27d0.ray + 0xe8);
                    *(uint *)(local_27d0.ray + 0xec) =
                         (uint)bVar11 * iVar31 | (uint)!bVar11 * *(int *)(local_27d0.ray + 0xec);
                    iVar1 = *(int *)(local_27d0.hit + 0x34);
                    iVar30 = *(int *)(local_27d0.hit + 0x38);
                    iVar31 = *(int *)(local_27d0.hit + 0x3c);
                    bVar12 = (bool)((byte)(uVar44 >> 1) & 1);
                    bVar10 = (bool)((byte)(uVar44 >> 2) & 1);
                    bVar11 = SUB81(uVar44 >> 3,0);
                    *(uint *)(local_27d0.ray + 0xf0) =
                         (uint)(bVar32 & 1) * *(int *)(local_27d0.hit + 0x30) |
                         (uint)!(bool)(bVar32 & 1) * *(int *)(local_27d0.ray + 0xf0);
                    *(uint *)(local_27d0.ray + 0xf4) =
                         (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_27d0.ray + 0xf4);
                    *(uint *)(local_27d0.ray + 0xf8) =
                         (uint)bVar10 * iVar30 | (uint)!bVar10 * *(int *)(local_27d0.ray + 0xf8);
                    *(uint *)(local_27d0.ray + 0xfc) =
                         (uint)bVar11 * iVar31 | (uint)!bVar11 * *(int *)(local_27d0.ray + 0xfc);
                    iVar1 = *(int *)(local_27d0.hit + 0x44);
                    iVar30 = *(int *)(local_27d0.hit + 0x48);
                    iVar31 = *(int *)(local_27d0.hit + 0x4c);
                    bVar12 = (bool)((byte)(uVar44 >> 1) & 1);
                    bVar10 = (bool)((byte)(uVar44 >> 2) & 1);
                    bVar11 = SUB81(uVar44 >> 3,0);
                    *(uint *)(local_27d0.ray + 0x100) =
                         (uint)(bVar32 & 1) * *(int *)(local_27d0.hit + 0x40) |
                         (uint)!(bool)(bVar32 & 1) * *(int *)(local_27d0.ray + 0x100);
                    *(uint *)(local_27d0.ray + 0x104) =
                         (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_27d0.ray + 0x104);
                    *(uint *)(local_27d0.ray + 0x108) =
                         (uint)bVar10 * iVar30 | (uint)!bVar10 * *(int *)(local_27d0.ray + 0x108);
                    *(uint *)(local_27d0.ray + 0x10c) =
                         (uint)bVar11 * iVar31 | (uint)!bVar11 * *(int *)(local_27d0.ray + 0x10c);
                    auVar45 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_27d0.hit + 0x50));
                    *(undefined1 (*) [16])(local_27d0.ray + 0x110) = auVar45;
                    auVar45 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_27d0.hit + 0x60));
                    *(undefined1 (*) [16])(local_27d0.ray + 0x120) = auVar45;
                    auVar45 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_27d0.hit + 0x70));
                    *(undefined1 (*) [16])(local_27d0.ray + 0x130) = auVar45;
                    auVar45 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_27d0.hit + 0x80));
                    *(undefined1 (*) [16])(local_27d0.ray + 0x140) = auVar45;
                    local_27a0 = ZEXT432(*(uint *)(ray + k * 4 + 0x80));
                  }
                  auVar67 = ZEXT3264(local_27a0);
                  uVar62 = local_27a0._0_4_;
                  auVar66._4_4_ = uVar62;
                  auVar66._0_4_ = uVar62;
                  auVar66._8_4_ = uVar62;
                  auVar66._12_4_ = uVar62;
                  auVar66._16_4_ = uVar62;
                  auVar66._20_4_ = uVar62;
                  auVar66._24_4_ = uVar62;
                  auVar66._28_4_ = uVar62;
                  auVar76 = ZEXT3264(local_26a0);
                  uVar44 = vcmpps_avx512vl(local_26a0,auVar66,2);
                  uVar38 = (byte)(~(byte)(1 << ((uint)local_2808 & 0x1f)) & (byte)uVar38) & uVar44;
                  auVar88 = ZEXT3264(local_25c0);
                  auVar89 = ZEXT3264(local_25e0);
                  auVar90 = ZEXT3264(local_2600);
                  auVar46 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                  auVar91 = ZEXT3264(auVar46);
                  auVar92 = ZEXT3264(local_2620);
                  auVar93 = ZEXT3264(local_2640);
                  auVar94 = ZEXT3264(local_2660);
                  auVar46 = vmovdqa64_avx512vl(local_2680);
                  auVar95 = ZEXT3264(auVar46);
                  auVar45 = vmovdqa64_avx512vl(local_2770);
                  auVar96 = ZEXT1664(auVar45);
                  auVar46 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
                  auVar97 = ZEXT3264(auVar46);
                  auVar46 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
                  auVar98 = ZEXT3264(auVar46);
                  auVar45 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
                  auVar99 = ZEXT1664(auVar45);
                  auVar46 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
                  auVar100 = ZEXT3264(auVar46);
                }
                bVar32 = (byte)uVar38;
                if (bVar32 == 0) break;
                auVar65._8_4_ = 0x7f800000;
                auVar65._0_8_ = 0x7f8000007f800000;
                auVar65._12_4_ = 0x7f800000;
                auVar65._16_4_ = 0x7f800000;
                auVar65._20_4_ = 0x7f800000;
                auVar65._24_4_ = 0x7f800000;
                auVar65._28_4_ = 0x7f800000;
                auVar46 = vblendmps_avx512vl(auVar65,auVar76._0_32_);
                auVar61._0_4_ =
                     (uint)(bVar32 & 1) * auVar46._0_4_ | (uint)!(bool)(bVar32 & 1) * 0x7f800000;
                bVar12 = (bool)((byte)(uVar38 >> 1) & 1);
                auVar61._4_4_ = (uint)bVar12 * auVar46._4_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar38 >> 2) & 1);
                auVar61._8_4_ = (uint)bVar12 * auVar46._8_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar38 >> 3) & 1);
                auVar61._12_4_ = (uint)bVar12 * auVar46._12_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar38 >> 4) & 1);
                auVar61._16_4_ = (uint)bVar12 * auVar46._16_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar38 >> 5) & 1);
                auVar61._20_4_ = (uint)bVar12 * auVar46._20_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar38 >> 6) & 1);
                auVar61._24_4_ = (uint)bVar12 * auVar46._24_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = SUB81(uVar38 >> 7,0);
                auVar61._28_4_ = (uint)bVar12 * auVar46._28_4_ | (uint)!bVar12 * 0x7f800000;
                auVar46 = vshufps_avx(auVar61,auVar61,0xb1);
                auVar46 = vminps_avx(auVar61,auVar46);
                auVar47 = vshufpd_avx(auVar46,auVar46,5);
                auVar46 = vminps_avx(auVar46,auVar47);
                auVar47 = vpermpd_avx2(auVar46,0x4e);
                auVar46 = vminps_avx(auVar46,auVar47);
                uVar23 = vcmpps_avx512vl(auVar61,auVar46,0);
                bVar32 = (byte)uVar23 & bVar32;
                uVar37 = (uint)uVar38;
                if (bVar32 != 0) {
                  uVar37 = (uint)bVar32;
                }
                uVar36 = 0;
                for (; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x80000000) {
                  uVar36 = uVar36 + 1;
                }
              } while( true );
            }
          }
          local_27f0 = local_27f0 + 1;
        } while (local_27f0 != local_27d8);
      }
      uVar62 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar67 = ZEXT3264(CONCAT428(uVar62,CONCAT424(uVar62,CONCAT420(uVar62,CONCAT416(uVar62,
                                                  CONCAT412(uVar62,CONCAT48(uVar62,CONCAT44(uVar62,
                                                  uVar62))))))));
      uVar38 = local_27e8;
    }
LAB_0079c258:
    if (local_27e0 == &local_23a0) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }